

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void check_dtd_chain(DLword type)

{
  uint uVar1;
  uint *puVar2;
  undefined6 in_register_0000003a;
  uint LAddr;
  char *cp;
  
  puVar2 = (uint *)((long)DTDspace +
                   (CONCAT62(in_register_0000003a,type) & 0xffffffff) * 4 +
                   (ulong)(uint)((int)CONCAT62(in_register_0000003a,type) << 5) + 8);
  cp = "Free pointer is ODD!";
  while( true ) {
    uVar1 = *puVar2;
    LAddr = uVar1 & 0xfffffff;
    if (LAddr == 0) {
      return;
    }
    if ((uVar1 & 1) != 0) break;
    if ((uVar1 >> 0x1b & 1) != 0) {
      error("impossibly-big free pointer!");
    }
    if ((*(ushort *)((ulong)(LAddr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != type) {
      cp = "BAD cell in next dtdfree ";
      break;
    }
    puVar2 = NativeAligned4FromLAddr(LAddr);
  }
  error(cp);
  return;
}

Assistant:

void check_dtd_chain(DLword type)
{
  LispPTR next, onext;

  onext = 0;
  next = ((struct dtd *)GetDTD(type))->dtd_free;
  next &= POINTERMASK;

  while (next != NIL) {
    if (next & 1) {
      error("Free pointer is ODD!");
      return;
    }

    if (next & 0x8000000) error("impossibly-big free pointer!");

    if (type != GetTypeNumber(next)) {
      error("BAD cell in next dtdfree ");
      return;
    }
    onext = next;
    next = *((LispPTR *)NativeAligned4FromLAddr(next));
    next &= POINTERMASK;
  }
}